

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

float Rml::ComputeFontsize
                (NumericValue value,ComputedValues *values,ComputedValues *parent_values,
                ComputedValues *document_values,float dp_ratio,Vector2f vp_dimensions)

{
  code *pcVar1;
  bool bVar2;
  Unit UVar3;
  float fVar4;
  float fVar5;
  
  UVar3 = value.unit;
  if (((ulong)value >> 0x20 & 0x1820) == 0) {
LAB_001e5355:
    fVar5 = ComputeLength(value,0.0,0.0,dp_ratio,vp_dimensions);
    return fVar5;
  }
  fVar5 = value.number;
  if (UVar3 == REM) {
    if (document_values == (ComputedValues *)0x0 || values == document_values) {
      if ((computed_property_data._8_8_ == 0) &&
         (bVar2 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), !bVar2)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      fVar5 = fVar5 * *(float *)(computed_property_data._8_8_ + 0x70);
    }
    else {
      fVar5 = fVar5 * (document_values->inherited).font_size;
    }
  }
  else {
    if (UVar3 == EM) {
      fVar4 = 1.0;
    }
    else {
      if (UVar3 != PERCENT) goto LAB_001e5355;
      fVar4 = 0.01;
    }
    if (parent_values == (ComputedValues *)0x0) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = fVar4 * fVar5 * (parent_values->inherited).font_size;
    }
  }
  return fVar5;
}

Assistant:

float ComputeFontsize(NumericValue value, const Style::ComputedValues& values, const Style::ComputedValues* parent_values,
	const Style::ComputedValues* document_values, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & (Unit::PERCENT | Unit::EM | Unit::REM)))
	{
		// Relative values are based on the parent's or document's font size instead of our own.
		float multiplier = 1.0f;

		switch (value.unit)
		{
		case Unit::PERCENT:
			multiplier = 0.01f;
			//-fallthrough
		case Unit::EM:
			if (!parent_values)
				return 0;
			return value.number * multiplier * parent_values->font_size();

		case Unit::REM:
			// If the current element is a document, the rem unit is relative to the default size.
			if (!document_values || &values == document_values)
				return value.number * DefaultComputedValues().font_size();

			// Otherwise it is relative to the document font size.
			return value.number * document_values->font_size();
		default: break;
		}
	}

	// Font-relative lengths handled above, other lengths should be handled as normal.
	return ComputeLength(value, 0.f, 0.f, dp_ratio, vp_dimensions);
}